

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebmlstring.c
# Opt level: O2

err_t EBML_UniStringSetValue(ebml_string *Element,tchar_t *Value)

{
  bool_t bVar1;
  err_t eVar2;
  char Data [2048];
  
  bVar1 = Node_IsPartOf(Element,0x55534245);
  if (bVar1 == 0) {
    eVar2 = -3;
  }
  else {
    Node_ToUTF8(Element,Data,0x7ff,Value);
    Data[0x7ff] = '\0';
    eVar2 = EBML_StringSetValue(Element,Data);
  }
  return eVar2;
}

Assistant:

err_t EBML_UniStringSetValue(ebml_string *Element,const tchar_t *Value)
{
    char Data[2048];
    if (!Node_IsPartOf(Element,EBML_UNISTRING_CLASS))
        return ERR_INVALID_DATA;
    Node_ToUTF8(Element,Data,sizeof(Data)-1,Value);
    Data[sizeof(Data)-1] = 0;
    return EBML_StringSetValue(Element,Data);
}